

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

char * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>::rec_serialize
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default> *this,Siblings *sib,
          char *buffer)

{
  Siblings *sib_00;
  pointer bg;
  reference ppVar1;
  short *buffer_00;
  pointer ppVar2;
  size_t __n;
  const_iterator __begin0;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
  local_38;
  
  *(short *)buffer = (short)(sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  buffer_00 = (short *)(buffer + 2);
  local_38.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
        *)(sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  ppVar2 = (pointer)local_38.m_ptr + (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  while (local_38.m_ptr !=
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
          *)ppVar2) {
    ppVar1 = boost::container::
             vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
             ::operator*(&local_38);
    *buffer_00 = ppVar1->first;
    __n = (long)*(pointer *)
                 ((long)&(ppVar1->second).super_Filtration_simplex_base.filt_.
                         super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(ppVar1->second).super_Filtration_simplex_base.filt_.
                super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    *(long *)(buffer_00 + 1) = (long)__n >> 2;
    memcpy(buffer_00 + 5,
           (ppVar1->second).super_Filtration_simplex_base.filt_.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start,__n);
    buffer_00 = (short *)((long)buffer_00 + __n + 10);
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
    ::operator++(&local_38);
  }
  local_38.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
        *)(sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  ppVar2 = (pointer)local_38.m_ptr + (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  while (local_38.m_ptr !=
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>
          *)ppVar2) {
    ppVar1 = boost::container::
             vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
             ::operator*(&local_38);
    sib_00 = (ppVar1->second).children_;
    if (sib_00->parent_ == ppVar1->first) {
      buffer_00 = (short *)rec_serialize(this,sib_00,(char *)buffer_00);
    }
    else {
      *buffer_00 = 0;
      buffer_00 = buffer_00 + 1;
    }
    boost::container::
    vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_default>_>_>_*,_true>
    ::operator++(&local_38);
  }
  return (char *)buffer_00;
}

Assistant:

char* rec_serialize(Siblings const *sib, char* buffer) const {
    char* ptr = buffer;
    ptr = serialize_value_to_char_buffer(static_cast<Vertex_handle>(sib->members().size()), ptr);
#ifdef DEBUG_TRACES
    std::clog << "\n" << sib->members().size() << " : ";
#endif  // DEBUG_TRACES
    for (auto& map_el : sib->members()) {
      ptr = serialize_value_to_char_buffer(map_el.first, ptr); // Vertex
      if (Options::store_filtration)
        ptr = serialize_value_to_char_buffer(map_el.second.filtration(), ptr); // Filtration
#ifdef DEBUG_TRACES
      std::clog << " [ " << map_el.first << " | " << map_el.second.filtration() << " ] ";
#endif  // DEBUG_TRACES
    }
    for (auto& map_el : sib->members()) {
      if (has_children(&map_el)) {
        ptr = rec_serialize(map_el.second.children(), ptr);
      } else {
        ptr = serialize_value_to_char_buffer(static_cast<Vertex_handle>(0), ptr);
#ifdef DEBUG_TRACES
        std::cout << "\n0 : ";
#endif  // DEBUG_TRACES
      }
    }
    return ptr;
  }